

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_appendADynArray_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray destArray;
  
  destArray.buffer = (char *)0x0;
  destArray.reallocator._0_4_ = 0x10a480;
  destArray.reallocator._4_4_ = 0;
  destArray.deallocator._0_4_ = 0x10a4c0;
  destArray.deallocator._4_4_ = 0;
  destArray.size = 5;
  destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  destArray.capacity = 5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x1161eb;
  destArray.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  builtin_strncpy(destArray.buffer,"01234",5);
  uStack_50 = 0x116205;
  pcVar3 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  pcVar3[2] = '\0';
  pcVar3[0] = '5';
  pcVar3[1] = '6';
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x116239;
  bVar1 = private_ACUtils_ADynArray_insertArray(&destArray,0xffffffffffffffff,pcVar3,3,1);
  if (bVar1 == true) {
    uStack_50 = 0x116253;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5c8);
    if (destArray.size == 8) {
      uStack_50 = 0x116273;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x5c9);
      if (destArray.capacity == 8) {
        uStack_50 = 0x116293;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x5ca);
        if (destArray.buffer == (char *)0x0) {
          pcVar3 = "(void*) destArray.buffer != NULL";
          pcVar8 = "(void*) destArray.buffer";
          iVar2 = 0x5cb;
          goto LAB_00116563;
        }
        uStack_50 = 0x1162b0;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x5cb);
        pcVar9 = destArray.buffer;
        if (destArray.buffer == (char *)0x0) {
          pcVar8 = "";
          pcVar9 = "(null)";
        }
        else {
          uStack_50 = 0x1162cd;
          iVar2 = strcmp("0123456",destArray.buffer);
          if (iVar2 == 0) {
            uStack_50 = 0x1162e6;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5cc);
            if (destArray.growStrategy == (ACUtilsGrowStrategy)0x0) {
              pcVar3 = "(void*) destArray.growStrategy != NULL";
              pcVar8 = "(void*) destArray.growStrategy";
              iVar2 = 0x5cd;
LAB_00116563:
              uStack_50 = 0;
              local_58 = (char *)0x0;
              pcStack_60 = (char *)0x11656a;
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                                "Assertion \'%s\' failed: %s == %#x",pcVar3,pcVar8);
            }
            uStack_50 = 0x116306;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5cd);
            uStack_50 = 0x116313;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5ce);
            uStack_50 = 0x116320;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5cf);
            if (pcVar3 == (char *)0x0) {
              pcVar3 = "(void*) srcArray.buffer != NULL";
              pcVar8 = "(void*) srcArray.buffer";
              iVar2 = 0x5d0;
              goto LAB_00116563;
            }
            uStack_50 = 0x11633a;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5d0);
            uStack_50 = 0x11634c;
            iVar2 = strcmp("56",pcVar3);
            if (iVar2 != 0) {
              pcVar8 = "\"";
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar6 = "srcArray.buffer == \"56\"";
              pcVar7 = "srcArray.buffer";
              iVar2 = 0x5d1;
              local_58 = "\"";
              pcStack_60 = "56";
              pcStack_68 = "\"";
              pcStack_70 = "\"56\"";
              pcStack_78 = "\"";
              ppcVar5 = &pcStack_80;
              pcStack_80 = pcVar3;
              goto LAB_001165e8;
            }
            uStack_50 = 0x116368;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5d1);
            uStack_50 = 0x116375;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5d2);
            if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
              uStack_50 = 0x116397;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x5d3);
              uStack_50 = 0x1163a0;
              (*(code *)CONCAT44(destArray.deallocator._4_4_,destArray.deallocator._0_4_))
                        (destArray.buffer);
              private_ACUtilsTest_ADynArray_freeCount = private_ACUtilsTest_ADynArray_freeCount + 1;
              uStack_50 = 0x1163af;
              free(pcVar3);
              return;
            }
            pcStack_60 = "1";
            pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
            pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x5d3;
            pcVar8 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            goto LAB_001165e0;
          }
          pcVar8 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar6 = "destArray.buffer == \"0123456\"";
        pcVar7 = "destArray.buffer";
        iVar2 = 0x5cc;
        local_58 = "\"";
        pcStack_60 = "0123456";
        pcStack_68 = "\"";
        pcStack_70 = "\"0123456\"";
        ppcVar5 = &pcStack_80;
        pcStack_80 = pcVar9;
        pcStack_78 = pcVar8;
        goto LAB_001165e8;
      }
      pcVar6 = "destArray.capacity == 8";
      pcVar7 = "destArray.capacity";
      iVar2 = 0x5ca;
      pcVar8 = (char *)destArray.capacity;
    }
    else {
      pcVar6 = "destArray.size == 8";
      pcVar7 = "destArray.size";
      iVar2 = 0x5c9;
      pcVar8 = (char *)destArray.size;
    }
    pcStack_60 = "8";
    local_58 = (char *)0x8;
  }
  else {
    pcVar8 = (char *)(ulong)bVar1;
    pcStack_60 = "true";
    pcVar6 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer))) == true"
    ;
    pcVar7 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer)))"
    ;
    iVar2 = 0x5c8;
LAB_001165e0:
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &pcStack_60;
LAB_001165e8:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) = test_ADynArray_appendADynArray_success_nullptrSrcArray_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar4,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendADynArray_success_notEnoughCapacity)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "01234", 5);
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "56", 3);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendADynArray(&destArray, &srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "56");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    destArray.deallocator(destArray.buffer);
    srcArray.deallocator(srcArray.buffer);
}